

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.h
# Opt level: O0

void __thiscall
FSkyVertex::SetXYZ(FSkyVertex *this,float xx,float yy,float zz,float uu,float vv,PalEntry col)

{
  float vv_local;
  float uu_local;
  float zz_local;
  float yy_local;
  float xx_local;
  FSkyVertex *this_local;
  PalEntry col_local;
  
  this->x = xx;
  this->y = yy;
  this->z = zz;
  this->u = uu;
  this->v = vv;
  (this->color).field_0.field_0 =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)col.field_0;
  return;
}

Assistant:

void SetXYZ(float xx, float yy, float zz, float uu = 0, float vv = 0, PalEntry col = 0xffffffff)
	{
		x = xx;
		y = yy;
		z = zz;
		u = uu;
		v = vv;
		color = col;
	}